

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O2

uint32_t __thiscall
booster::locale::impl_posix::mb2_iconv_converter::to_unicode
          (mb2_iconv_converter *this,char **begin,char *end)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t uVar3;
  uint32_t result [2];
  char inseq [3];
  size_t insize;
  char *outbuf;
  size_t outsize;
  char *inbuf;
  
  pbVar2 = (byte *)*begin;
  uVar3 = 0xfffffffe;
  if (pbVar2 != (byte *)end) {
    bVar1 = *pbVar2;
    uVar3 = (((this->first_byte_table_).
              super___shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[bVar1];
    if (uVar3 == 0xfffffffe) {
      uVar3 = 0xfffffffe;
      if (pbVar2 + 1 != (byte *)end) {
        open(this,(char *)&this->to_utf_,0x1b0983,(this->encoding_)._M_dataplus._M_p);
        inbuf = inseq;
        inseq[1] = (*begin)[1];
        inseq[2] = '\0';
        insize = 3;
        result[0] = 0xffffffff;
        result[1] = 0xffffffff;
        outsize = 8;
        inseq[0] = bVar1;
        outbuf = (char *)result;
        iconv(this->to_utf_,&inbuf,&insize,&outbuf,&outsize);
        uVar3 = 0xffffffff;
        if (((outsize == 0) && (insize == 0)) && (result[1] == 0)) {
          *begin = *begin + 2;
          uVar3 = result[0];
        }
      }
    }
    else if (uVar3 != 0xffffffff) {
      *begin = (char *)(pbVar2 + 1);
    }
  }
  return uVar3;
}

Assistant:

uint32_t to_unicode(char const *&begin,char const *end)
        {
            if(begin == end)
                return incomplete;
            
            unsigned char seq0 = *begin;
            uint32_t index = (*first_byte_table_)[seq0];
            if(index == illegal)
                return illegal;
            if(index != incomplete) {
                begin++;
                return index;
            }
            else if(begin+1 == end)
                return incomplete;
            
            open(to_utf_,utf32_encoding(),encoding_.c_str());

            // maybe illegal or may be double byte

            char inseq[3] = { static_cast<char>(seq0) , begin[1], 0};
            char *inbuf = inseq;
            size_t insize = 3;
            uint32_t result[2] = { illegal, illegal };
            size_t outsize = 8;
            char *outbuf = reinterpret_cast<char*>(result);
            call_iconv(to_utf_,&inbuf,&insize,&outbuf,&outsize);
            if(outsize == 0 && insize == 0 && result[1]==0 ) {
                begin+=2;
                return result[0];
            }
            return illegal;
        }